

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O3

CBString * sectionTypeToUString(CBString *__return_storage_ptr__,UINT8 type)

{
  int iVar1;
  undefined7 in_register_00000031;
  char *s;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
    s = "Compressed";
    break;
  case 2:
    s = "GUID defined";
    break;
  case 3:
    s = "Disposable";
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x1a:
  case 0x1d:
  case 0x1e:
  case 0x1f:
switchD_001120d9_caseD_4:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",type);
    return __return_storage_ptr__;
  case 0x10:
    s = "PE32 image";
    break;
  case 0x11:
    s = "PIC image";
    break;
  case 0x12:
    s = "TE image";
    break;
  case 0x13:
    s = "DXE dependency";
    break;
  case 0x14:
    s = "Version";
    break;
  case 0x15:
    s = "UI";
    break;
  case 0x16:
    s = "16-bit image";
    break;
  case 0x17:
    s = "Volume image";
    break;
  case 0x18:
    s = "Freeform subtype GUID";
    break;
  case 0x19:
    s = "Raw";
    break;
  case 0x1b:
    s = "PEI dependency";
    break;
  case 0x1c:
    s = "MM dependency";
    break;
  case 0x20:
    s = "Insyde postcode";
    break;
  default:
    if (iVar1 != 0xf0) goto switchD_001120d9_caseD_4;
    s = "Phoenix postcode";
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString sectionTypeToUString(const UINT8 type)
{
    switch (type) {
        case EFI_SECTION_COMPRESSION:               return UString("Compressed");
        case EFI_SECTION_GUID_DEFINED:              return UString("GUID defined");
        case EFI_SECTION_DISPOSABLE:                return UString("Disposable");
        case EFI_SECTION_PE32:                      return UString("PE32 image");
        case EFI_SECTION_PIC:                       return UString("PIC image");
        case EFI_SECTION_TE:                        return UString("TE image");
        case EFI_SECTION_DXE_DEPEX:                 return UString("DXE dependency");
        case EFI_SECTION_VERSION:                   return UString("Version");
        case EFI_SECTION_USER_INTERFACE:            return UString("UI");
        case EFI_SECTION_COMPATIBILITY16:           return UString("16-bit image");
        case EFI_SECTION_FIRMWARE_VOLUME_IMAGE:     return UString("Volume image");
        case EFI_SECTION_FREEFORM_SUBTYPE_GUID:     return UString("Freeform subtype GUID");
        case EFI_SECTION_RAW:                       return UString("Raw");
        case EFI_SECTION_PEI_DEPEX:                 return UString("PEI dependency");
        case EFI_SECTION_MM_DEPEX:                  return UString("MM dependency");
        case INSYDE_SECTION_POSTCODE:               return UString("Insyde postcode");
        case PHOENIX_SECTION_POSTCODE:              return UString("Phoenix postcode");
    }
    return usprintf("Unknown %02Xh", type);
}